

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O0

void daccontrol_update(void *info,UINT32 samples,DEV_SMPL **dummy)

{
  uint local_34;
  uint local_30;
  UINT32 cmdsToProc;
  INT32 RealDataStp;
  dac_control *chip;
  DEV_SMPL **dummy_local;
  UINT32 samples_local;
  void *info_local;
  
  if (((*(byte *)((long)info + 0x7c) & 0x80) == 0) && ((*(byte *)((long)info + 0x7c) & 1) != 0)) {
    if (*(char *)((long)info + 0x7d) == '\0') {
      local_34 = (uint)*(byte *)((long)info + 0x98);
    }
    else {
      local_34 = -(uint)*(byte *)((long)info + 0x98);
    }
    RC_STEPS((RATIO_CNTR *)((long)info + 0x80),samples);
    local_30 = RC_GET_VAL((RATIO_CNTR *)((long)info + 0x80));
    RC_MASK((RATIO_CNTR *)((long)info + 0x80));
    if (*(uint *)((long)info + 0x90) < local_30) {
      local_30 = *(uint *)((long)info + 0x90);
    }
    *(uint *)((long)info + 0x90) = *(int *)((long)info + 0x90) - local_30;
    if (0x20 < local_30) {
      *(uint *)((long)info + 0x94) = local_34 * (local_30 - 0x10) + *(int *)((long)info + 0x94);
      local_30 = 0x10;
    }
    for (; local_30 != 0; local_30 = local_30 - 1) {
      daccontrol_SendCommand((dac_control *)info);
      *(uint *)((long)info + 0x94) = local_34 + *(int *)((long)info + 0x94);
    }
    if ((*(int *)((long)info + 0x90) == 0) && ((*(byte *)((long)info + 0x7c) & 4) != 0)) {
      *(undefined4 *)((long)info + 0x90) = *(undefined4 *)((long)info + 0x78);
      if (*(char *)((long)info + 0x7d) == '\0') {
        *(undefined4 *)((long)info + 0x94) = 0;
      }
      else {
        *(uint *)((long)info + 0x94) =
             (*(int *)((long)info + 0x78) + -1) * (uint)*(byte *)((long)info + 0x98);
      }
    }
    if (*(int *)((long)info + 0x90) == 0) {
      *(byte *)((long)info + 0x7c) = *(byte *)((long)info + 0x7c) & 0xfe;
    }
  }
  return;
}

Assistant:

void daccontrol_update(void* info, UINT32 samples, DEV_SMPL** dummy)
{
	dac_control* chip = (dac_control*)info;
	INT32 RealDataStp;
	UINT32 cmdsToProc;
	
	if (chip->Running & 0x80)	// disabled
		return;
	if (! (chip->Running & 0x01))	// stopped
		return;
	
	RealDataStp = (chip->Reverse) ? -chip->DataStep : +chip->DataStep;
	
	RC_STEPS(&chip->stepCntr, samples);
	cmdsToProc = RC_GET_VAL(&chip->stepCntr);
	RC_MASK(&chip->stepCntr);
	
	if (cmdsToProc > chip->RemainCmds)
		cmdsToProc = chip->RemainCmds;
	chip->RemainCmds -= cmdsToProc;
	
	if (cmdsToProc > 0x20)
	{
		// very effective Speed Hack for fast seeking
		chip->RealPos += RealDataStp * (cmdsToProc - 0x10);
		cmdsToProc = 0x10;
	}
	
	for (; cmdsToProc > 0; cmdsToProc --)
	{
		daccontrol_SendCommand(chip);
		chip->RealPos += RealDataStp;
	}
	
	if (! chip->RemainCmds && (chip->Running & 0x04))
	{
		// loop back to start
		chip->RemainCmds = chip->CmdsToSend;
		if (! chip->Reverse)
			chip->RealPos = 0x00;
		else
			chip->RealPos = (chip->CmdsToSend - 1) * chip->DataStep;
	}
	
	if (! chip->RemainCmds)
		chip->Running &= ~0x01;	// stop
	
	return;
}